

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O1

void llvm::APInt::tcShiftRight(WordType *Dst,uint Words,uint Count)

{
  uint uVar1;
  sbyte sVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (Count == 0) {
    return;
  }
  uVar1 = Count >> 6;
  uVar5 = Words;
  if (uVar1 < Words) {
    uVar5 = uVar1;
  }
  uVar6 = (ulong)(Words - uVar5);
  if ((Count & 0x3f) == 0) {
    memmove(Dst,Dst + uVar5,(ulong)((Words - uVar5) * 8));
  }
  else if (uVar1 < Words) {
    sVar2 = (sbyte)(Count & 0x3f);
    if (uVar1 < Words) {
      Words = uVar1;
    }
    uVar3 = 0;
    do {
      uVar4 = Dst[Words + (int)uVar3] >> sVar2;
      Dst[uVar3] = uVar4;
      if (uVar6 - 1 != uVar3) {
        Dst[uVar3] = Dst[Words + 1 + (int)uVar3] << (0x40U - sVar2 & 0x3f) | uVar4;
      }
      uVar3 = uVar3 + 1;
    } while (uVar6 != uVar3);
  }
  memset(Dst + uVar6,0,(ulong)(uVar5 << 3));
  return;
}

Assistant:

void APInt::tcShiftRight(WordType *Dst, unsigned Words, unsigned Count) {
  // Don't bother performing a no-op shift.
  if (!Count)
    return;

  // WordShift is the inter-part shift; BitShift is the intra-part shift.
  unsigned WordShift = std::min(Count / APINT_BITS_PER_WORD, Words);
  unsigned BitShift = Count % APINT_BITS_PER_WORD;

  unsigned WordsToMove = Words - WordShift;
  // Fastpath for moving by whole words.
  if (BitShift == 0) {
    std::memmove(Dst, Dst + WordShift, WordsToMove * APINT_WORD_SIZE);
  } else {
    for (unsigned i = 0; i != WordsToMove; ++i) {
      Dst[i] = Dst[i + WordShift] >> BitShift;
      if (i + 1 != WordsToMove)
        Dst[i] |= Dst[i + WordShift + 1] << (APINT_BITS_PER_WORD - BitShift);
    }
  }

  // Fill in the remainder with 0s.
  std::memset(Dst + WordsToMove, 0, WordShift * APINT_WORD_SIZE);
}